

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_flats.cpp
# Opt level: O1

void __thiscall GLFlat::DrawSubsectors(GLFlat *this,int pass,bool processlights,bool istrans)

{
  uint uVar1;
  uint uVar2;
  subsector_t *psVar3;
  sector_t *psVar4;
  undefined7 in_register_00000009;
  ulong uVar5;
  long lVar6;
  long *plVar7;
  int index;
  int iVar8;
  int dli;
  int local_38;
  uint local_34;
  
  uVar5 = CONCAT71(in_register_00000009,istrans) & 0xffffffff;
  local_38 = this->dynlightindex;
  FRenderState::Apply(&gl_RenderState);
  iVar8 = this->vboindex;
  psVar4 = this->sector;
  if (iVar8 < 0) {
    if (0 < psVar4->subsectorcount) {
      lVar6 = 0;
      do {
        psVar3 = psVar4->subsectors[lVar6];
        if ((((gl_drawinfo->ss_renderflags).Array
              [((long)psVar3 - (long)subsectors >> 5) * -0x5555555555555555] & this->renderflags) ==
             0 & ((byte)uVar5 ^ 1)) == 0) {
          if (processlights) {
            SetupSubsectorLights(this,0,psVar3,&local_38);
          }
          DrawSubsector(this,psVar3);
        }
        lVar6 = lVar6 + 1;
        psVar4 = this->sector;
      } while (lVar6 < psVar4->subsectorcount);
    }
  }
  else if (0 < psVar4->subsectorcount) {
    lVar6 = 0;
    uVar5 = uVar5 ^ 1;
    local_34 = (uint)uVar5;
    do {
      psVar3 = psVar4->subsectors[lVar6];
      if ((((gl_drawinfo->ss_renderflags).Array
            [((long)psVar3 - (long)subsectors >> 5) * -0x5555555555555555] & this->renderflags) == 0
          & (byte)uVar5) == 0) {
        if (processlights) {
          SetupSubsectorLights(this,0,psVar3,&local_38);
        }
        (*_ptrc_glDrawArrays)(6,iVar8,psVar3->numlines);
        flatvertices = flatvertices + psVar3->numlines;
        flatprimitives = flatprimitives + 1;
        uVar5 = (ulong)local_34;
      }
      iVar8 = iVar8 + psVar3->numlines;
      lVar6 = lVar6 + 1;
      psVar4 = this->sector;
    } while (lVar6 < psVar4->subsectorcount);
  }
  if ((this->renderflags & 4) == 0) {
    uVar1 = this->sector->sectornum;
    if ((this->renderflags & 1) == 0) {
      lVar6 = 0x98;
      uVar2 = (gl_drawinfo->otherceilingplanes).Count;
    }
    else {
      lVar6 = 0x88;
      uVar2 = (gl_drawinfo->otherfloorplanes).Count;
    }
    if (uVar1 < uVar2) {
      plVar7 = *(long **)(*(long *)(&gl_drawinfo->temporary + lVar6) + (ulong)uVar1 * 8);
    }
    else {
      plVar7 = (long *)0x0;
    }
    if (plVar7 != (long *)0x0) {
      do {
        if (processlights) {
          SetupSubsectorLights(this,0,(subsector_t *)plVar7[1],&local_38);
        }
        DrawSubsector(this,(subsector_t *)plVar7[1]);
        plVar7 = (long *)*plVar7;
      } while (plVar7 != (long *)0x0);
    }
    return;
  }
  return;
}

Assistant:

void GLFlat::DrawSubsectors(int pass, bool processlights, bool istrans)
{
	int dli = dynlightindex;

	gl_RenderState.Apply();
	if (vboindex >= 0)
	{
		int index = vboindex;
		for (int i=0; i<sector->subsectorcount; i++)
		{
			subsector_t * sub = sector->subsectors[i];
				
			if (gl_drawinfo->ss_renderflags[sub-subsectors]&renderflags || istrans)
			{
				if (processlights) SetupSubsectorLights(GLPASS_ALL, sub, &dli);
				drawcalls.Clock();
				glDrawArrays(GL_TRIANGLE_FAN, index, sub->numlines);
				drawcalls.Unclock();
				flatvertices += sub->numlines;
				flatprimitives++;
			}
			index += sub->numlines;
		}
	}
	else
	{
		// Draw the subsectors belonging to this sector
		// (can this case even happen?)
		for (int i=0; i<sector->subsectorcount; i++)
		{
			subsector_t * sub = sector->subsectors[i];
			if (gl_drawinfo->ss_renderflags[sub-subsectors]&renderflags || istrans)
			{
				if (processlights) SetupSubsectorLights(GLPASS_ALL, sub, &dli);
				DrawSubsector(sub);
			}
		}
	}

	// Draw the subsectors assigned to it due to missing textures
	if (!(renderflags&SSRF_RENDER3DPLANES))
	{
		gl_subsectorrendernode * node = (renderflags&SSRF_RENDERFLOOR)?
			gl_drawinfo->GetOtherFloorPlanes(sector->sectornum) :
			gl_drawinfo->GetOtherCeilingPlanes(sector->sectornum);

		while (node)
		{
			if (processlights) SetupSubsectorLights(GLPASS_ALL, node->sub, &dli);
			DrawSubsector(node->sub);
			node = node->next;
		}
	}
}